

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.h
# Opt level: O2

void os_interface_linux_address_interrupt(os_interface_ip_change *addr)

{
  list_entity *plVar1;
  list_entity *plVar2;
  
  plVar1 = (addr->_internal)._node.next;
  if ((plVar1 != (list_entity *)0x0) &&
     (plVar2 = (addr->_internal)._node.prev, plVar2 != (list_entity *)0x0)) {
    plVar2->next = plVar1;
    plVar1->prev = plVar2;
    (addr->_internal)._node.next = (list_entity *)0x0;
    (addr->_internal)._node.prev = (list_entity *)0x0;
    if (addr->cb_finished != (_func_void_os_interface_ip_change_ptr_int *)0x0) {
      (*addr->cb_finished)(addr,-1);
      return;
    }
  }
  return;
}

Assistant:

static INLINE bool
list_is_node_added(const struct list_entity *node) {
  return node->next != NULL && node->prev != NULL;
}